

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_context_setIntrinsicPrimitiveMethod
          (sysbvm_context_t *context,sysbvm_tuple_t ownerClass,char *selectorString,
          size_t argumentCount,sysbvm_bitflags_t flags,void *userdata,
          sysbvm_functionEntryPoint_t entryPoint)

{
  sysbvm_tuple_t method;
  sysbvm_tuple_t selector;
  undefined1 local_78 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_ae8be5de gcFrame;
  void *userdata_local;
  sysbvm_bitflags_t flags_local;
  size_t argumentCount_local;
  char *selectorString_local;
  sysbvm_tuple_t ownerClass_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x20);
  memset(local_78,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_78);
  method = sysbvm_function_createPrimitive(context,argumentCount,flags,userdata,entryPoint);
  selector = sysbvm_symbol_internWithCString(context,selectorString);
  sysbvm_type_setMethodWithSelector(context,ownerClass,selector,method);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_78);
  return method;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_context_setIntrinsicPrimitiveMethod(sysbvm_context_t *context, sysbvm_tuple_t ownerClass, const char *selectorString, size_t argumentCount, sysbvm_bitflags_t flags, void *userdata, sysbvm_functionEntryPoint_t entryPoint)
{
    struct {
        sysbvm_tuple_t symbol;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t primitiveFunction;
        sysbvm_tuple_t ownerClass;
    } gcFrame = {
        .ownerClass = ownerClass
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.primitiveFunction = sysbvm_function_createPrimitive(context, argumentCount, flags, userdata, entryPoint);
    gcFrame.selector = sysbvm_symbol_internWithCString(context, selectorString);
    sysbvm_type_setMethodWithSelector(context, gcFrame.ownerClass, gcFrame.selector, gcFrame.primitiveFunction);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.primitiveFunction;
}